

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O3

SUNErrCode
SUNAdaptController_EstimateStep_ImExGus
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  ulong *puVar1;
  double __y;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  double __x;
  double __x_00;
  double dVar8;
  double __y_00;
  double __y_01;
  double local_78;
  
  puVar1 = (ulong *)C->content;
  if ((int)puVar1[7] == 0) {
    uVar7 = (ulong)DAT_00175110;
    dVar8 = (double)(p + 1);
    __y_01 = (double)(puVar1[2] ^ uVar7) / dVar8;
    __y_00 = (double)(puVar1[3] ^ uVar7) / dVar8;
    __y = (double)(*puVar1 ^ uVar7) / dVar8;
    __x_00 = dsm * (double)puVar1[4];
    __x = __x_00 / (double)puVar1[5];
    dVar8 = (double)(puVar1[1] ^ uVar7) / dVar8;
    dVar2 = (double)puVar1[6];
    dVar3 = pow(__x_00,__y);
    dVar4 = pow(__x,dVar8);
    dVar5 = pow(__x_00,__y_01);
    dVar6 = pow(__x,__y_00);
    if (dVar6 * dVar5 <= dVar4 * dVar3 * (h / dVar2)) {
      local_78 = pow(__x_00,__y_01);
    }
    else {
      local_78 = pow(__x_00,__y);
      local_78 = (h / dVar2) * local_78;
      __y_00 = dVar8;
    }
    dVar2 = pow(__x,__y_00);
    dVar2 = dVar2 * local_78;
  }
  else {
    dVar2 = pow(dsm * (double)puVar1[4],-1.0 / (double)(p + 1));
  }
  *hnew = dVar2 * h;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_ImExGus(SUNAdaptController C,
                                                   sunrealtype h, int p,
                                                   sunrealtype dsm,
                                                   sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);

  /* order parameter to use */
  const int ord = p + 1;

  /* compute estimated time step size, modifying the first step formula */
  if (SACIMEXGUS_FIRSTSTEP(C))
  {
    /* set usable time-step adaptivity parameters -- first step */
    const sunrealtype k = -SUN_RCONST(1.0) / ord;
    const sunrealtype e = SACIMEXGUS_BIAS(C) * dsm;
    *hnew               = h * SUNRpowerR(e, k);
  }
  else
  {
    /* set usable time-step adaptivity parameters -- subsequent steps */
    const sunrealtype k1e  = -SACIMEXGUS_K1E(C) / ord;
    const sunrealtype k2e  = -SACIMEXGUS_K2E(C) / ord;
    const sunrealtype k1i  = -SACIMEXGUS_K1I(C) / ord;
    const sunrealtype k2i  = -SACIMEXGUS_K2I(C) / ord;
    const sunrealtype e1   = SACIMEXGUS_BIAS(C) * dsm;
    const sunrealtype e2   = e1 / SACIMEXGUS_EP(C);
    const sunrealtype hrat = h / SACIMEXGUS_HP(C);
    *hnew = h * SUNMIN(hrat * SUNRpowerR(e1, k1i) * SUNRpowerR(e2, k2i),
                       SUNRpowerR(e1, k1e) * SUNRpowerR(e2, k2e));
  }

  /* return with success */
  return SUN_SUCCESS;
}